

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determineIncludes.cpp
# Opt level: O2

void determineIncludes(Module *module,Program *program)

{
  bool bVar1;
  Module *pMVar2;
  undefined1 auVar3 [16];
  string trimmed;
  string name;
  
  for (pMVar2 = module + 0x20; pMVar2 = *(Module **)pMVar2, pMVar2 != module + 0x18;
      pMVar2 = pMVar2 + 8) {
    auVar3 = llvm::Value::getName();
    trimmed._0_16_ = auVar3;
    llvm::StringRef::str_abi_cxx11_(&name,(StringRef *)&trimmed);
    trimPrefix(&trimmed,&name);
    bVar1 = isCFunc(&trimmed);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&name);
    }
    bVar1 = isStdLibFunc(&name);
    if (bVar1) {
      program->hasStdLib = true;
    }
    bVar1 = isStringFunc(&name);
    if (bVar1) {
      program->hasString = true;
    }
    bVar1 = isStdioFunc(&name);
    if (bVar1) {
      program->hasStdio = true;
    }
    bVar1 = isPthreadFunc(&name);
    if (bVar1) {
      program->hasPthread = true;
    }
    bVar1 = isCMath(&name);
    if (bVar1) {
      program->hasCMath = true;
    }
    std::__cxx11::string::~string((string *)&trimmed);
    std::__cxx11::string::~string((string *)&name);
  }
  Program::addPass(program,DetermineIncludes);
  return;
}

Assistant:

void determineIncludes(const llvm::Module* module, Program& program) {
    for (const llvm::Function& func : module->functions()) {
        std::string name = func.getName().str();
        std::string trimmed = trimPrefix(name);

        if (isCFunc(trimmed)) {
            name = trimmed;
        }

        if (isStdLibFunc(name)) {
            program.hasStdLib = true;
        }

        if (isStringFunc(name)) {
            program.hasString = true;
        }

        if (isStdioFunc(name)) {
            program.hasStdio = true;
        }

        if (isPthreadFunc(name)) {
            program.hasPthread = true;
        }

        if (isCMath(name)) {
            program.hasCMath = true;
        }

    }

    program.addPass(PassType::DetermineIncludes);
}